

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O2

XrResult RuntimeInterface::TryLoadingSingleRuntime
                   (string *openxr_command,
                   unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                   *manifest_file)

{
  ManifestFile *this;
  RuntimeInterface *pRVar1;
  pointer pXVar2;
  XrResult __val;
  LoaderPlatformLibraryHandle runtime_library;
  string *psVar3;
  code *pcVar4;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar5;
  RuntimeInterface *this_00;
  char *pcVar6;
  pointer __src;
  string info_message;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_178;
  undefined8 uStack_160;
  PFN_xrGetInstanceProcAddr local_158;
  string warning_message;
  string library_message;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> extension_properties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  supported_extensions;
  string function_name;
  
  runtime_library =
       (LoaderPlatformLibraryHandle)
       dlopen((((manifest_file->_M_t).
                super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                ._M_t.
                super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>
                .super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)->
              super_ManifestFile)._library_path._M_dataplus._M_p,1);
  if (runtime_library == (LoaderPlatformLibraryHandle)0x0) {
    pcVar6 = (char *)dlerror();
    std::__cxx11::string::string((string *)&library_message,pcVar6,(allocator *)&warning_message);
    std::__cxx11::string::string
              ((string *)&warning_message,"RuntimeInterface::LoadRuntime skipping manifest file ",
               (allocator *)&local_178);
    std::__cxx11::string::append((string *)&warning_message);
    std::__cxx11::string::append((char *)&warning_message);
    std::__cxx11::string::append((string *)&warning_message);
    std::__cxx11::string::append((char *)&warning_message);
    local_178.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage(openxr_command,&warning_message,&local_178);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_178);
    std::__cxx11::string::~string((string *)&warning_message);
    std::__cxx11::string::~string((string *)&library_message);
    return XR_ERROR_FILE_ACCESS_ERROR;
  }
  this = &((manifest_file->_M_t).
           super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>.
           _M_t.
           super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>.
           super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)->super_ManifestFile;
  std::__cxx11::string::string
            ((string *)&library_message,"xrNegotiateLoaderRuntimeInterface",
             (allocator *)&warning_message);
  psVar3 = ManifestFile::GetFunctionName(this,&library_message);
  std::__cxx11::string::string((string *)&function_name,(string *)psVar3);
  std::__cxx11::string::~string((string *)&library_message);
  if (function_name._M_string_length == 0) {
    __assert_fail("!name.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK/src/loader/loader_platform.hpp"
                  ,0x40,
                  "void *LoaderPlatformLibraryGetProcAddr(LoaderPlatformLibraryHandle, const std::string &)"
                 );
  }
  pcVar4 = (code *)dlsym(runtime_library,function_name._M_dataplus._M_p);
  warning_message._M_dataplus._M_p = (pointer)0x100000001;
  warning_message._M_string_length = 0x28;
  warning_message.field_2._M_allocated_capacity = 0x100000001;
  warning_message.field_2._8_8_ = 0x1000000000000;
  local_178.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_160 = 0;
  local_158 = (PFN_xrGetInstanceProcAddr)0x0;
  local_178.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x100000003;
  local_178.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x28;
  if (pcVar4 == (code *)0x0) {
    std::__cxx11::string::string
              ((string *)&library_message,
               "RuntimeInterface::LoadRuntime failed to find negotiate function ",
               (allocator *)&info_message);
    std::__cxx11::string::append((string *)&library_message);
    info_message._M_dataplus._M_p = (pointer)0x0;
    info_message._M_string_length = 0;
    info_message.field_2._M_allocated_capacity = 0;
    LoaderLogger::LogErrorMessage
              (openxr_command,&library_message,
               (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&info_message);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
              ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&info_message);
    std::__cxx11::string::~string((string *)&library_message);
    __val = XR_ERROR_RUNTIME_FAILURE;
  }
  else {
    __val = (*pcVar4)(&warning_message,&local_178);
    if (XR_ERROR_VALIDATION_FAILURE < __val) {
      if (local_158 == (PFN_xrGetInstanceProcAddr)0x0) {
        std::__cxx11::string::string
                  ((string *)&library_message,
                   "RuntimeInterface::LoadRuntime skipping manifest file ",
                   (allocator *)&info_message);
        std::__cxx11::string::append((string *)&library_message);
        std::__cxx11::string::append((char *)&library_message);
        info_message._M_dataplus._M_p = (pointer)0x0;
        info_message._M_string_length = 0;
        info_message.field_2._M_allocated_capacity = 0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,&library_message,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&info_message)
        ;
      }
      else if ((uint)local_178.
                     super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
        if ((uStack_160 & 0xffff000000000000) == 0x1000000000000) {
          std::__cxx11::string::string
                    ((string *)&info_message,
                     "RuntimeInterface::LoadRuntime succeeded loading runtime defined in manifest file "
                     ,(allocator *)&library_message);
          std::__cxx11::string::append((string *)&info_message);
          std::__cxx11::string::append((char *)&info_message);
          std::__cxx11::to_string
                    (&library_message,
                     (uint)local_178.
                           super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::append((string *)&info_message);
          std::__cxx11::string::~string((string *)&library_message);
          std::__cxx11::string::append((char *)&info_message);
          std::__cxx11::to_string(&library_message,(uint)uStack_160._6_2_);
          std::__cxx11::string::append((string *)&info_message);
          std::__cxx11::string::~string((string *)&library_message);
          std::__cxx11::string::append((char *)&info_message);
          std::__cxx11::to_string(&library_message,(uint)uStack_160._4_2_);
          std::__cxx11::string::append((string *)&info_message);
          std::__cxx11::string::~string((string *)&library_message);
          library_message._M_dataplus._M_p = (pointer)0x0;
          library_message._M_string_length = 0;
          library_message.field_2._M_allocated_capacity = 0;
          LoaderLogger::LogInfoMessage
                    (openxr_command,&info_message,
                     (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                     &library_message);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                     &library_message);
          puVar5 = GetInstance();
          this_00 = (RuntimeInterface *)operator_new(0xf0);
          RuntimeInterface(this_00,runtime_library,local_158);
          pRVar1 = (puVar5->_M_t).
                   super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>
                   .super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl;
          (puVar5->_M_t).
          super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
          super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
          super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl = this_00;
          if (pRVar1 != (RuntimeInterface *)0x0) {
            (*pRVar1->_vptr_RuntimeInterface[1])();
          }
          supported_extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          supported_extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          supported_extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          extension_properties.
          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          extension_properties.
          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          extension_properties.
          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          puVar5 = GetInstance();
          GetInstanceExtensionProperties
                    ((puVar5->_M_t).
                     super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>
                     .super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl,
                     &extension_properties);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve(&supported_extensions,
                    ((long)extension_properties.
                           super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)extension_properties.
                          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x98);
          pXVar2 = extension_properties.
                   super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (__src = extension_properties.
                       super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start; __src != pXVar2; __src = __src + 1
              ) {
            memcpy(&library_message,__src,0x98);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char(&)[128]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &supported_extensions,(char (*) [128])&library_message.field_2);
          }
          puVar5 = GetInstance();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&((puVar5->_M_t).
                        super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>
                        .super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->
                       _supported_extensions,&supported_extensions);
          std::_Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::
          ~_Vector_base(&extension_properties.
                         super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                       );
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&supported_extensions);
          std::__cxx11::string::~string((string *)&info_message);
          __val = XR_SUCCESS;
          goto LAB_00115ad4;
        }
        std::__cxx11::string::string
                  ((string *)&library_message,
                   "RuntimeInterface::LoadRuntime skipping manifest file ",
                   (allocator *)&info_message);
        std::__cxx11::string::append((string *)&library_message);
        std::__cxx11::string::append((char *)&library_message);
        info_message._M_dataplus._M_p = (pointer)0x0;
        info_message._M_string_length = 0;
        info_message.field_2._M_allocated_capacity = 0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,&library_message,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&info_message)
        ;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&library_message,
                   "RuntimeInterface::LoadRuntime skipping manifest file ",
                   (allocator *)&info_message);
        std::__cxx11::string::append((string *)&library_message);
        std::__cxx11::string::append((char *)&library_message);
        info_message._M_dataplus._M_p = (pointer)0x0;
        info_message._M_string_length = 0;
        info_message.field_2._M_allocated_capacity = 0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,&library_message,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&info_message)
        ;
      }
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&info_message);
      std::__cxx11::string::~string((string *)&library_message);
      __val = XR_ERROR_FILE_CONTENTS_INVALID;
    }
  }
  std::__cxx11::string::string
            ((string *)&library_message,"RuntimeInterface::LoadRuntime skipping manifest file ",
             (allocator *)&info_message);
  std::__cxx11::string::append((string *)&library_message);
  std::__cxx11::string::append((char *)&library_message);
  std::__cxx11::to_string(&info_message,__val);
  std::__cxx11::string::append((string *)&library_message);
  std::__cxx11::string::~string((string *)&info_message);
  info_message._M_dataplus._M_p = (pointer)0x0;
  info_message._M_string_length = 0;
  info_message.field_2._M_allocated_capacity = 0;
  LoaderLogger::LogErrorMessage
            (openxr_command,&library_message,
             (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&info_message);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&info_message);
  dlclose(runtime_library);
  std::__cxx11::string::~string((string *)&library_message);
LAB_00115ad4:
  std::__cxx11::string::~string((string *)&function_name);
  return __val;
}

Assistant:

XrResult RuntimeInterface::TryLoadingSingleRuntime(const std::string& openxr_command,
                                                   std::unique_ptr<RuntimeManifestFile>& manifest_file) {
    LoaderPlatformLibraryHandle runtime_library = LoaderPlatformLibraryOpen(manifest_file->LibraryPath());
    if (nullptr == runtime_library) {
        std::string library_message = LoaderPlatformLibraryOpenError(manifest_file->LibraryPath());
        std::string warning_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
        warning_message += manifest_file->Filename();
        warning_message += ", failed to load with message \"";
        warning_message += library_message;
        warning_message += "\"";
        LoaderLogger::LogErrorMessage(openxr_command, warning_message);
        return XR_ERROR_FILE_ACCESS_ERROR;
    }
#ifdef XR_KHR_LOADER_INIT_SUPPORT
    if (!LoaderInitData::instance().initialized()) {
        LoaderLogger::LogErrorMessage(openxr_command, "RuntimeInterface::LoadRuntime skipping manifest file " +
                                                          manifest_file->Filename() +
                                                          " because xrInitializeLoaderKHR was not yet called.");

        LoaderPlatformLibraryClose(runtime_library);
        return XR_ERROR_VALIDATION_FAILURE;
    }
    bool forwardedInitLoader = false;
    {
        // If we have xrInitializeLoaderKHR exposed as an export, forward call to it.
        const auto function_name = manifest_file->GetFunctionName("xrInitializeLoaderKHR");
        auto initLoader =
            reinterpret_cast<PFN_xrInitializeLoaderKHR>(LoaderPlatformLibraryGetProcAddr(runtime_library, function_name));
        if (initLoader != nullptr) {
            // we found the entry point one way or another.
            LoaderLogger::LogInfoMessage(openxr_command,
                                         "RuntimeInterface::LoadRuntime forwarding xrInitializeLoaderKHR call to runtime before "
                                         "calling xrNegotiateLoaderRuntimeInterface.");
            XrResult res = initLoader(LoaderInitData::instance().getParam());
            if (!XR_SUCCEEDED(res)) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "RuntimeInterface::LoadRuntime forwarded call to xrInitializeLoaderKHR failed.");

                LoaderPlatformLibraryClose(runtime_library);
                return res;
            }
            forwardedInitLoader = true;
        }
    }
#endif

    // Get and settle on an runtime interface version (using any provided name if required).
    std::string function_name = manifest_file->GetFunctionName("xrNegotiateLoaderRuntimeInterface");
    auto negotiate =
        reinterpret_cast<PFN_xrNegotiateLoaderRuntimeInterface>(LoaderPlatformLibraryGetProcAddr(runtime_library, function_name));

    // Loader info for negotiation
    XrNegotiateLoaderInfo loader_info = {};
    loader_info.structType = XR_LOADER_INTERFACE_STRUCT_LOADER_INFO;
    loader_info.structVersion = XR_LOADER_INFO_STRUCT_VERSION;
    loader_info.structSize = sizeof(XrNegotiateLoaderInfo);
    loader_info.minInterfaceVersion = 1;
    loader_info.maxInterfaceVersion = XR_CURRENT_LOADER_RUNTIME_VERSION;
    loader_info.minApiVersion = XR_MAKE_VERSION(1, 0, 0);
    loader_info.maxApiVersion = XR_MAKE_VERSION(1, 0x3ff, 0xfff);  // Maximum allowed version for this major version.

    // Set up the runtime return structure
    XrNegotiateRuntimeRequest runtime_info = {};
    runtime_info.structType = XR_LOADER_INTERFACE_STRUCT_RUNTIME_REQUEST;
    runtime_info.structVersion = XR_RUNTIME_INFO_STRUCT_VERSION;
    runtime_info.structSize = sizeof(XrNegotiateRuntimeRequest);

    // Skip calling the negotiate function and fail if the function pointer
    // could not get loaded
    XrResult res = XR_ERROR_RUNTIME_FAILURE;
    if (nullptr != negotiate) {
        res = negotiate(&loader_info, &runtime_info);
    } else {
        std::string error_message = "RuntimeInterface::LoadRuntime failed to find negotiate function ";
        error_message += function_name;
        LoaderLogger::LogErrorMessage(openxr_command, error_message);
    }
    // If we supposedly succeeded, but got a nullptr for GetInstanceProcAddr
    // then something still went wrong, so return with an error.
    if (XR_SUCCEEDED(res)) {
        uint32_t runtime_major = XR_VERSION_MAJOR(runtime_info.runtimeApiVersion);
        uint32_t runtime_minor = XR_VERSION_MINOR(runtime_info.runtimeApiVersion);
        uint32_t loader_major = XR_VERSION_MAJOR(XR_CURRENT_API_VERSION);
        if (nullptr == runtime_info.getInstanceProcAddr) {
            std::string error_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
            error_message += manifest_file->Filename();
            error_message += ", negotiation succeeded but returned NULL getInstanceProcAddr";
            LoaderLogger::LogErrorMessage(openxr_command, error_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        } else if (0 >= runtime_info.runtimeInterfaceVersion ||
                   XR_CURRENT_LOADER_RUNTIME_VERSION < runtime_info.runtimeInterfaceVersion) {
            std::string error_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
            error_message += manifest_file->Filename();
            error_message += ", negotiation succeeded but returned invalid interface version";
            LoaderLogger::LogErrorMessage(openxr_command, error_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        } else if (runtime_major != loader_major || (runtime_major == 0 && runtime_minor == 0)) {
            std::string error_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
            error_message += manifest_file->Filename();
            error_message += ", OpenXR version returned not compatible with this loader";
            LoaderLogger::LogErrorMessage(openxr_command, error_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        }
    }
#ifdef XR_KHR_LOADER_INIT_SUPPORT
    if (XR_SUCCEEDED(res) && !forwardedInitLoader) {
        // Forward initialize loader call, where possible and if we did not do so before.
        PFN_xrVoidFunction initializeVoid = nullptr;
        PFN_xrInitializeLoaderKHR initialize = nullptr;

        // Now we may try asking xrGetInstanceProcAddr
        if (XR_SUCCEEDED(runtime_info.getInstanceProcAddr(XR_NULL_HANDLE, "xrInitializeLoaderKHR", &initializeVoid))) {
            if (initializeVoid == nullptr) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "RuntimeInterface::LoadRuntime got success from xrGetInstanceProcAddr "
                                              "for xrInitializeLoaderKHR, but output a null pointer.");
                res = XR_ERROR_RUNTIME_FAILURE;
            } else {
                initialize = reinterpret_cast<PFN_xrInitializeLoaderKHR>(initializeVoid);
            }
        }
        if (initialize != nullptr) {
            // we found the entry point one way or another.
            LoaderLogger::LogInfoMessage(openxr_command,
                                         "RuntimeInterface::LoadRuntime forwarding xrInitializeLoaderKHR call to runtime after "
                                         "calling xrNegotiateLoaderRuntimeInterface.");
            res = initialize(LoaderInitData::instance().getParam());
            if (!XR_SUCCEEDED(res)) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "RuntimeInterface::LoadRuntime forwarded call to xrInitializeLoaderKHR failed.");
            }
        }
    }
#endif
    if (XR_FAILED(res)) {
        std::string warning_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
        warning_message += manifest_file->Filename();
        warning_message += ", negotiation failed with error ";
        warning_message += std::to_string(res);
        LoaderLogger::LogErrorMessage(openxr_command, warning_message);
        LoaderPlatformLibraryClose(runtime_library);
        return res;
    }

    std::string info_message = "RuntimeInterface::LoadRuntime succeeded loading runtime defined in manifest file ";
    info_message += manifest_file->Filename();
    info_message += " using interface version ";
    info_message += std::to_string(runtime_info.runtimeInterfaceVersion);
    info_message += " and OpenXR API version ";
    info_message += std::to_string(XR_VERSION_MAJOR(runtime_info.runtimeApiVersion));
    info_message += ".";
    info_message += std::to_string(XR_VERSION_MINOR(runtime_info.runtimeApiVersion));
    LoaderLogger::LogInfoMessage(openxr_command, info_message);

    // Use this runtime
    GetInstance().reset(new RuntimeInterface(runtime_library, runtime_info.getInstanceProcAddr));

    // Grab the list of extensions this runtime supports for easy filtering after the
    // xrCreateInstance call
    std::vector<std::string> supported_extensions;
    std::vector<XrExtensionProperties> extension_properties;
    GetInstance()->GetInstanceExtensionProperties(extension_properties);
    supported_extensions.reserve(extension_properties.size());
    for (XrExtensionProperties ext_prop : extension_properties) {
        supported_extensions.emplace_back(ext_prop.extensionName);
    }
    GetInstance()->SetSupportedExtensions(supported_extensions);

    return XR_SUCCESS;
}